

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

bool BicTest3<Blob<128>,Blob<224>>(pfHash hash,int reps,bool verbose)

{
  long lVar1;
  ulong uVar2;
  int *piVar3;
  undefined1 auVar4 [32];
  uint32_t uVar5;
  uint32_t uVar6;
  void *__s;
  ulong uVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined8 in_XMM7_Qb;
  Blob<224> d;
  Blob<128> key;
  Blob<224> h2;
  Blob<224> h1;
  uint local_f8;
  uint local_f4;
  void *local_e0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  Rand local_88;
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  undefined1 auStack_68 [12];
  undefined4 uStack_5c;
  undefined1 local_58 [12];
  undefined4 uStack_4c;
  undefined1 auStack_48 [12];
  undefined4 uStack_3c;
  undefined1 auVar20 [32];
  
  local_88.x = 0x88e23b73;
  local_88.y = 0x11310f6c;
  local_88.z = 0x18847f4;
  local_88.w = 0x1142a2ba;
  auStack_48 = SUB1612((undefined1  [16])0x0,4);
  auStack_68 = SUB1612((undefined1  [16])0x0,4);
  local_98 = (undefined1  [16])0x0;
  local_58 = SUB1612((undefined1  [16])0x0,0);
  uStack_4c = 0;
  local_78 = SUB1612((undefined1  [16])0x0,0);
  uStack_6c = 0;
  __s = operator_new(0x6200000);
  lVar13 = 0;
  memset(__s,0,0x6200000);
  local_e0 = (void *)((long)__s + 0x10);
  do {
    if ((byte)((byte)((char)lVar13 * -0x55) >> 2 | (char)lVar13 * -0x40) < 0x16) {
      putchar(0x2e);
    }
    if (0 < reps) {
      local_f4 = 0;
      do {
        Rand::rand_p(&local_88,local_98,0x10);
        (*hash)(local_98,0x10,0,local_58);
        flipbit(local_98,0x10,(uint32_t)lVar13);
        (*hash)(local_98,0x10,0,local_78);
        lVar11 = -0xdf;
        auVar4._12_4_ = uStack_4c;
        auVar4._0_12_ = local_58;
        auVar4._16_12_ = auStack_48;
        auVar4._28_4_ = uStack_3c;
        auVar19 = vmovdqu8_avx512vl(auVar4);
        auVar20._0_28_ = auVar19._0_28_;
        auVar20._30_2_ = auVar19._30_2_;
        auVar20._28_2_ = 0;
        auVar19._12_4_ = uStack_6c;
        auVar19._0_12_ = local_78;
        auVar19._16_12_ = auStack_68;
        auVar19._28_4_ = uStack_5c;
        auVar19 = vmovdqu8_avx512vl(auVar19);
        auVar21._0_28_ = auVar19._0_28_;
        auVar21._30_2_ = auVar19._30_2_;
        auVar21._28_2_ = 0;
        local_b8 = vmovdqu8_avx512vl(auVar21 ^ auVar20);
        pvVar8 = local_e0;
        lVar15 = 0;
        do {
          lVar1 = lVar15 + 1;
          lVar12 = lVar11;
          lVar16 = (long)pvVar8;
          do {
            uVar5 = getbit(local_b8,0x1c,(uint32_t)lVar15);
            uVar6 = getbit(local_b8,0x1c,(int)lVar12 + 0xe0);
            piVar3 = (int *)(lVar16 + (ulong)(uVar6 * 2 | uVar5) * 4);
            *piVar3 = *piVar3 + 1;
            lVar16 = lVar16 + 0x10;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0);
          pvVar8 = (void *)((long)pvVar8 + 0xe10);
          lVar11 = lVar11 + 1;
          lVar15 = lVar1;
        } while (lVar1 != 0xdf);
        local_f4 = local_f4 + 1;
      } while (local_f4 != reps);
    }
    local_e0 = (void *)((long)local_e0 + 0xc4000);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x80);
  putchar(10);
  auVar27 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar28 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar29 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar17 = 1;
  uVar14 = 0;
  local_f8 = 0;
  local_f4 = 0;
  auVar23 = ZEXT864(0) << 0x40;
  uVar7 = 0;
  local_e0 = __s;
LAB_0014e206:
  uVar2 = uVar7 + 1;
  uVar18 = uVar17;
LAB_0014e214:
  if (verbose) {
    printf("(%3d,%3d) - ",uVar7 & 0xffffffff,uVar18 & 0xffffffff);
    auVar29 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar28 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar27 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar23 = ZEXT864(auVar23._0_8_);
  }
  uVar10 = 0;
LAB_0014e265:
  do {
    auVar26 = ZEXT864(0) << 0x40;
    lVar13 = 0;
    do {
      lVar15 = lVar13 * 4;
      lVar13 = lVar13 + 1;
      auVar24._0_8_ =
           (double)*(int *)((long)local_e0 + lVar15 + uVar10 * 0xc4000 + uVar18 * 0x10) /
           (double)(reps / 2);
      auVar24._8_8_ = in_XMM7_Qb;
      auVar24 = vfmadd213sd_fma(auVar24,auVar27._0_16_,auVar28._0_16_);
      auVar24 = vandpd_avx(auVar24,auVar29._0_16_);
      auVar24 = vmaxsd_avx(auVar24,auVar26._0_16_);
      auVar26 = ZEXT1664(auVar24);
    } while (lVar13 != 4);
    dVar25 = auVar24._0_8_;
    if (auVar23._0_8_ < dVar25) {
      uVar14 = uVar10 & 0xffffffff;
      auVar23 = ZEXT1664(auVar24);
      local_f8 = (uint)uVar7;
      local_f4 = (uint)uVar18;
    }
    if (!verbose) goto LAB_0014e32a;
    iVar9 = 0x2e;
    uVar22 = auVar23._0_8_;
    if ((0.01 <= dVar25) && (iVar9 = 0x6f, 0.05 <= dVar25)) {
      iVar9 = (uint)(0.33 <= dVar25) * 9 + 0x4f;
    }
    putchar(iVar9);
    auVar23 = ZEXT864(uVar22);
    auVar27 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar28 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar29 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x80);
  if (verbose) {
    putchar(10);
    auVar29 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar28 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar27 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar23 = ZEXT864(uVar22);
    uVar18 = uVar18 + 1;
    if (uVar18 == 0xe0) {
      iVar9 = 0x8c;
      do {
        putchar(0x2d);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      putchar(10);
      auVar23 = ZEXT864(uVar22);
      auVar27 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar28 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar29 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      goto LAB_0014e3d4;
    }
    goto LAB_0014e214;
  }
  goto LAB_0014e381;
LAB_0014e32a:
  uVar10 = uVar10 + 1;
  if (uVar10 == 0x80) goto LAB_0014e381;
  goto LAB_0014e265;
LAB_0014e381:
  uVar18 = uVar18 + 1;
  if (uVar18 == 0xe0) goto LAB_0014e3d4;
  goto LAB_0014e214;
LAB_0014e3d4:
  local_e0 = (void *)((long)local_e0 + 0xe00);
  uVar17 = uVar17 + 1;
  uVar7 = uVar2;
  if (uVar2 == 0xdf) {
    printf("Max bias %f - (%3d : %3d,%3d)\n",uVar14,(ulong)local_f8,(ulong)local_f4);
    operator_delete(__s);
    return auVar23._0_8_ < 0.05;
  }
  goto LAB_0014e206;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}